

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

string * __thiscall
vkt::ssbo::(anonymous_namespace)::getShaderName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BufferBlock *block,
          int instanceNdx,BufferVar *var,TypeComponentVector *accessPath)

{
  undefined8 uVar1;
  ostream *poVar2;
  undefined4 in_register_0000000c;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  end;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin;
  VarType curType;
  ostringstream name;
  VarType local_1c0;
  ostringstream local_1a8 [376];
  
  end._M_current = (VarTypeComponent *)var;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (*(char **)(this + 0x20) != (char *)0x0 && *(long *)(this + 0x28) != 0) {
    std::operator<<((ostream *)local_1a8,*(char **)(this + 0x20));
    if (0 < *(int *)(this + 0x58)) {
      poVar2 = std::operator<<((ostream *)local_1a8,"[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)block);
      std::operator<<(poVar2,"]");
    }
    std::operator<<((ostream *)local_1a8,".");
  }
  std::operator<<((ostream *)local_1a8,*(char **)CONCAT44(in_register_0000000c,instanceNdx));
  for (begin._M_current = (VarTypeComponent *)(var->m_name)._M_dataplus._M_p;
      begin._M_current != (VarTypeComponent *)(var->m_name)._M_string_length;
      begin._M_current = begin._M_current + 1) {
    if ((begin._M_current)->type == ARRAY_ELEMENT) {
      poVar2 = std::operator<<((ostream *)local_1a8,"[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(begin._M_current)->index);
      std::operator<<(poVar2,"]");
    }
    else if ((begin._M_current)->type == STRUCT_MEMBER) {
      glu::
      getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                (&local_1c0,(glu *)((undefined8 *)CONCAT44(in_register_0000000c,instanceNdx) + 4),
                 (VarType *)(var->m_name)._M_dataplus._M_p,begin,end);
      uVar1 = local_1c0.m_data.basic;
      poVar2 = std::operator<<((ostream *)local_1a8,".");
      std::operator<<(poVar2,(((StructType *)uVar1)->m_members).
                             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                             ._M_impl.super__Vector_impl_data._M_start[(begin._M_current)->index].
                             m_name._M_dataplus._M_p);
      glu::VarType::~VarType(&local_1c0);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string getShaderName (const BufferBlock& block, int instanceNdx, const BufferVar& var, const glu::TypeComponentVector& accessPath)
{
	std::ostringstream name;

	if (block.getInstanceName())
	{
		name << block.getInstanceName();

		if (block.isArray())
			name << "[" << instanceNdx << "]";

		name << ".";
	}
	else
		DE_ASSERT(instanceNdx == 0);

	name << var.getName();

	for (glu::TypeComponentVector::const_iterator pathComp = accessPath.begin(); pathComp != accessPath.end(); pathComp++)
	{
		if (pathComp->type == glu::VarTypeComponent::STRUCT_MEMBER)
		{
			const VarType		curType		= glu::getVarType(var.getType(), accessPath.begin(), pathComp);
			const StructType*	structPtr	= curType.getStructPtr();

			name << "." << structPtr->getMember(pathComp->index).getName();
		}
		else if (pathComp->type == glu::VarTypeComponent::ARRAY_ELEMENT)
			name << "[" << pathComp->index << "]";
		else
			DE_ASSERT(false);
	}

	return name.str();
}